

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManFromIfLogicAndVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  uint uVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint *puVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int Fill;
  int Fill_00;
  word *pwVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint *pTruth;
  word *__s;
  Gia_Man_t *p;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int pVarsAll [12];
  int pVarsThat [12];
  int pVarsThis [12];
  word pThis [64];
  word pFunc [64];
  uint local_710;
  uint local_70c;
  undefined1 local_708 [16];
  If_Cut_t *local_6f0;
  Gia_Man_t *local_6e8;
  ulong local_6e0;
  Vec_Int_t *local_6d8;
  Vec_Int_t *local_6d0;
  uint auStack_6c8 [12];
  uint auStack_698 [12];
  uint auStack_668 [12];
  word local_638 [64];
  word local_438 [64];
  word local_238 [65];
  ulong uVar11;
  
  local_6d0 = vCover;
  if (pCutBest->iCutFunc < 0) {
LAB_002123ff:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar1 = *(uint *)&pCutBest->field_0x1c;
  uVar9 = uVar1 >> 0x18;
  uVar11 = (ulong)uVar9;
  uVar17 = (uint)pCutBest->iCutFunc >> 1;
  if (pIfMan->vTtDecs[uVar11]->nSize <= (int)uVar17) {
LAB_002123e0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = pIfMan->vTtDecs[uVar11]->pArray[uVar17];
  local_6e0 = (ulong)(ushort)uVar2;
  uVar14 = uVar2 & 0xffff;
  uVar18 = uVar2 >> 0x10 & 0x3fff;
  local_710 = uVar18;
  local_70c = uVar14;
  local_6f0 = pCutBest;
  if ((((int)uVar2 < 1) || (iVar6 = pIfMan->pPars->nLutSize, 0xd < iVar6)) ||
     ((int)(iVar6 - (iVar6 >> 0x1f) & 0xfffffffeU) < (int)uVar9)) {
    __assert_fail("Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x6c6,
                  "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  pVVar3 = pIfMan->vTtMem[uVar11];
  if (pVVar3 == (Vec_Mem_t *)0x0) {
    pwVar16 = (word *)0x0;
  }
  else {
    if (pVVar3->nEntries <= (int)uVar17) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar16 = pVVar3->ppPages[uVar17 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
              (ulong)(uVar17 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
  }
  uVar17 = pIfMan->nTruth6Words[uVar11];
  local_6e8 = pNew;
  if (uVar2 < 0x40000000) {
    if (0 < (int)uVar17) {
      memcpy(local_238,pwVar16,(ulong)uVar17 << 3);
    }
  }
  else if (0 < (int)uVar17) {
    uVar13 = 0;
    do {
      local_238[uVar13] = ~pwVar16[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar17 != uVar13);
  }
  uVar17 = Abc_TtBitCount8[uVar14 >> 8] + Abc_TtBitCount8[(ulong)uVar2 & 0xff];
  if (iVar6 / 2 < (int)uVar17) {
    __assert_fail("Abc_TtBitCount16(This) <= nSuppLim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc6a,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
  }
  uVar14 = Abc_TtBitCount8[uVar18 >> 8] + Abc_TtBitCount8[uVar2 >> 0x10 & 0xff];
  if (iVar6 / 2 < (int)uVar14) {
    __assert_fail("Abc_TtBitCount16(That) <= nSuppLim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc6b,"void Abc_TtDeriveBiDec(word *, int, int, int, int, word *, word *)");
  }
  local_708._0_8_ = Abc_TtDeriveBiDecOne(local_238,uVar9,uVar2 & 0xffff);
  local_638[0] = Abc_TtDeriveBiDecOne(local_238,uVar9,uVar18);
  local_438[0] = local_708._0_8_;
  local_708._8_8_ = local_638[0];
  uVar15 = 1 << ((char)(uVar1 >> 0x18) - 6U & 0x1f);
  if (uVar1 < 0x7000000) {
    uVar15 = 1;
  }
  pwVar16 = local_438;
  memset(pwVar16,0,0x200);
  __s = local_638;
  memset(__s,0,0x200);
  if (0xcffffff < uVar1) {
    __assert_fail("nVars <= 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc30,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
  }
  if (uVar1 < 0x1000000) {
    uVar5 = 0;
    if (uVar17 != 0) goto LAB_00212573;
  }
  else {
    lVar12 = uVar11 - 1;
    auVar21._8_4_ = (int)lVar12;
    auVar21._0_8_ = lVar12;
    auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar13 = 0;
    auVar21 = auVar21 ^ _DAT_0093d220;
    auVar22 = _DAT_0093d210;
    do {
      auVar23 = auVar22 ^ _DAT_0093d220;
      if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                  auVar21._4_4_ < auVar23._4_4_) & 1)) {
        auStack_6c8[uVar13] = (uint)uVar13;
      }
      if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
          auVar23._12_4_ <= auVar21._12_4_) {
        auStack_6c8[uVar13 + 1] = (uint)uVar13 + 1;
      }
      uVar13 = uVar13 + 2;
      lVar12 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar12 + 2;
    } while ((uVar9 + 1 & 0x1e) != uVar13);
    uVar5 = 0;
    uVar10 = 0;
    do {
      if (((uint)local_6e0 >> (uVar10 & 0x1f) & 1) != 0) {
        lVar12 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        auStack_668[lVar12] = uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
    if (uVar5 != uVar17) {
LAB_00212573:
      __assert_fail("k == nThis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0xc36,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
    }
    uVar5 = 0;
    uVar10 = 0;
    do {
      if ((uVar18 >> (uVar10 & 0x1f) & 1) != 0) {
        lVar12 = (long)(int)uVar5;
        uVar5 = uVar5 + 1;
        auStack_698[lVar12] = uVar10;
      }
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  uVar13 = (ulong)uVar15;
  if (uVar5 != uVar14) {
    __assert_fail("k == nThat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc3a,"int Abc_TtVerifyBiDec(word *, int, int, int, int, word, word)");
  }
  if (uVar17 != uVar9) {
    if ((int)uVar9 <= (int)uVar17) goto LAB_002125b1;
    uVar18 = 1 << ((char)uVar17 - 6U & 0x1f);
    if ((int)uVar17 < 7) {
      uVar18 = 1;
    }
    if (uVar18 != uVar15) {
      if ((int)uVar15 <= (int)uVar18) goto LAB_0021260e;
      if (0 < (int)uVar15) {
        lVar12 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar19 = 0;
            do {
              pwVar16[uVar19] = local_438[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar18 != uVar19);
          }
          lVar12 = lVar12 + (int)uVar18;
          pwVar16 = pwVar16 + (int)uVar18;
        } while (lVar12 < (long)uVar13);
      }
    }
  }
  if (uVar14 != uVar9) {
    if ((int)uVar9 <= (int)uVar14) {
LAB_002125b1:
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar18 = 1 << ((char)uVar14 - 6U & 0x1f);
    if ((int)uVar14 < 7) {
      uVar18 = 1;
    }
    if (uVar18 != uVar15) {
      if ((int)uVar15 <= (int)uVar18) {
LAB_0021260e:
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      if (0 < (int)uVar15) {
        lVar12 = 0;
        do {
          if (0 < (int)uVar18) {
            uVar19 = 0;
            do {
              __s[uVar19] = local_638[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar18 != uVar19);
          }
          lVar12 = lVar12 + (int)uVar18;
          __s = __s + (int)uVar18;
        } while (lVar12 < (long)uVar13);
      }
    }
  }
  uVar18 = uVar17 - 1;
  if ((0xffffff < uVar1) && (0 < (int)uVar17)) {
    uVar19 = uVar11;
    do {
      uVar20 = uVar19 - 1;
      if ((int)auStack_6c8[uVar20] <= (int)auStack_668[uVar18]) {
        if (auStack_6c8[uVar20] != auStack_668[uVar18]) goto LAB_0021245c;
        if (uVar18 < uVar20) {
          Abc_TtSwapVars(local_438,uVar9,uVar18,(int)uVar20);
        }
        uVar18 = uVar18 - 1;
      }
    } while ((1 < uVar19) && (uVar19 = uVar20, -1 < (int)uVar18));
  }
  if (uVar18 == 0xffffffff) {
    uVar17 = uVar14 - 1;
    if ((0xffffff < uVar1) && (0 < (int)uVar14)) {
      uVar19 = uVar11;
      do {
        uVar20 = uVar19 - 1;
        if ((int)auStack_6c8[uVar20] <= (int)auStack_698[uVar17]) {
          if (auStack_6c8[uVar20] != auStack_698[uVar17]) {
LAB_0021245c:
            __assert_fail("pCut[i] == pCut0[k]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x73c,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
          }
          if (uVar17 < uVar20) {
            Abc_TtSwapVars(local_638,uVar9,uVar17,(int)uVar20);
          }
          uVar17 = uVar17 - 1;
        }
      } while ((1 < uVar19) && (uVar19 = uVar20, -1 < (int)uVar17));
    }
    if (uVar17 == 0xffffffff) {
      uVar2 = uVar2 >> 0x1e;
      if (0 < (int)uVar15) {
        uVar19 = 0;
        do {
          if (local_238[uVar19] != (local_638[uVar19] & local_438[uVar19])) {
            puts("Bi-decomposition verification failed.");
            break;
          }
          uVar19 = uVar19 + 1;
        } while (uVar13 != uVar19);
      }
      iVar6 = -uVar2;
      auVar23._0_8_ = (long)iVar6;
      auVar23._8_4_ = iVar6;
      auVar23._12_4_ = iVar6 >> 0x1f;
      local_708 = auVar23 ^ local_708;
      pTruth = (uint *)local_708;
      puVar7 = &local_70c;
      pwVar16 = local_438;
      bVar8 = true;
      local_6d8 = vLeaves;
      do {
        vLeaves2->nSize = 0;
        if (uVar1 < 0x1000000) {
LAB_0021241e:
          __assert_fail("Vec_IntSize(vLeaves2) >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x6d1,
                        "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        uVar9 = *puVar7;
        uVar13 = 0;
        do {
          if ((uVar9 >> ((uint)uVar13 & 0x1f) & 1) != 0) {
            if ((long)vLeaves->nSize <= (long)uVar13) goto LAB_002123e0;
            Vec_IntPush(vLeaves2,vLeaves->pArray[uVar13]);
          }
          p = local_6e8;
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
        if (vLeaves2->nSize < 1) goto LAB_0021241e;
        uVar9 = Kit_TruthToGia(local_6e8,pTruth,vLeaves2->nSize,local_6d0,vLeaves2,0);
        *(uint *)pwVar16 = uVar9;
        if (vLeaves2->nSize != 1) {
          if ((int)uVar9 < 0) goto LAB_002123ff;
          uVar9 = uVar9 >> 1;
          if (p->nObjs <= (int)uVar9) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar17 = (uint)*(undefined8 *)(p->pObjs + uVar9);
          if (((int)uVar17 < 0) || ((uVar17 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                          ,0x6d6,
                          "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar6 = vMapping2->nSize;
          Vec_IntFillExtra(vMapping,uVar9 + 1,Fill);
          if (vMapping->nSize <= (int)uVar9) goto LAB_0021243d;
          vMapping->pArray[uVar9] = iVar6;
          Vec_IntPush(vMapping2,vLeaves2->nSize);
          vLeaves = local_6d8;
          p = local_6e8;
          if (0 < vLeaves2->nSize) {
            lVar12 = 0;
            do {
              if (vLeaves2->pArray[lVar12] < 0) goto LAB_002123ff;
              Vec_IntPush(vMapping2,(uint)vLeaves2->pArray[lVar12] >> 1);
              lVar12 = lVar12 + 1;
            } while (lVar12 < vLeaves2->nSize);
          }
          Vec_IntPush(vMapping2,uVar9);
        }
        pwVar16 = local_638;
        puVar7 = &local_710;
        pTruth = (uint *)(local_708 + 8);
        bVar4 = !bVar8;
        bVar8 = false;
        if (bVar4) {
          uVar1 = (uint)local_438[0];
          if ((-1 < (int)(uint)local_438[0]) &&
             (uVar9 = (uint)local_638[0], -1 < (int)(uint)local_638[0])) {
            uVar18 = Gia_ManAppendAnd(p,(uint)local_438[0] ^ uVar2,(uint)local_638[0] ^ uVar2);
            uVar17 = local_6f0->iCutFunc;
            if ((int)uVar17 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if (-1 < (int)uVar18) {
              uVar14 = uVar18 >> 1;
              iVar6 = vMapping2->nSize;
              Vec_IntFillExtra(vMapping,uVar14 + 1,Fill_00);
              if ((int)uVar14 < vMapping->nSize) {
                vMapping->pArray[uVar14] = iVar6;
                Vec_IntPush(vMapping2,2);
                Vec_IntPush(vMapping2,uVar1 >> 1);
                Vec_IntPush(vMapping2,uVar9 >> 1);
                Vec_IntPush(vMapping2,-uVar14);
                return *(uint *)&local_6f0->field_0x1c >> 0xc & 1 ^ uVar18 ^
                       (uint)(uVar2 != (uVar17 & 1));
              }
LAB_0021243d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
          }
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
      } while( true );
    }
  }
  __assert_fail("k == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
}

Assistant:

int Gia_ManFromIfLogicAndVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pFunc[64], uTruth[2];
    int nLeaves = pCutBest->nLeaves;
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, k, Mask = Vec_IntEntry(pIfMan->vTtDecs[nLeaves], truthId);
    int MaskOne[2] = { Mask & 0xFFFF, (Mask >> 16) & 0x3FFF };
    int iLitCofs[2], iTemp, fOrDec = (Mask >> 30) & 1, RetValue = -1; 
    assert( Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13 );
    Abc_TtCopy( pFunc, If_CutTruthWR(pIfMan, pCutBest), pIfMan->nTruth6Words[nLeaves], fOrDec );
    Abc_TtDeriveBiDec( pFunc, nLeaves, MaskOne[0], MaskOne[1], pIfMan->pPars->nLutSize/2, &uTruth[0], &uTruth[1] );
    uTruth[0] = fOrDec ? ~uTruth[0] : uTruth[0];
    uTruth[1] = fOrDec ? ~uTruth[1] : uTruth[1];
    for ( c = 0; c < 2; c++ )
    {
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nLeaves; k++ )
            if ( (MaskOne[c] >> k) & 1 )
                Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, k) );
        assert( Vec_IntSize(vLeaves2) >= 1 );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)&uTruth[c], Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        if ( Vec_IntSize(vLeaves2) == 1 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[0] = Abc_LitNotCond( iLitCofs[0], fOrDec );
    iLitCofs[1] = Abc_LitNotCond( iLitCofs[1], fOrDec );
    RetValue = Gia_ManAppendAnd( pNew, iLitCofs[0], iLitCofs[1] );
    RetValue = Abc_LitNotCond( RetValue, fOrDec ^ Abc_LitIsCompl(pCutBest->iCutFunc) );
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, 2 );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[0]) );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[1]) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(RetValue) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}